

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Instruction::addStringOperand(Instruction *this,char *str)

{
  char cVar1;
  int iVar2;
  uint immediate;
  
  immediate = 0;
  iVar2 = 0;
  do {
    while( true ) {
      cVar1 = *str;
      str = str + 1;
      immediate = (int)cVar1 << ((byte)iVar2 & 0x1f) | immediate;
      iVar2 = iVar2 + 8;
      if (iVar2 == 0x20) break;
      if (cVar1 == '\0') {
        if (iVar2 == 0) {
          return;
        }
        addImmediateOperand(this,immediate);
        return;
      }
    }
    addImmediateOperand(this,immediate);
    immediate = 0;
    iVar2 = 0;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void addStringOperand(const char* str)
    {
        unsigned int word = 0;
        unsigned int shiftAmount = 0;
        char c;

        do {
            c = *(str++);
            word |= ((unsigned int)c) << shiftAmount;
            shiftAmount += 8;
            if (shiftAmount == 32) {
                addImmediateOperand(word);
                word = 0;
                shiftAmount = 0;
            }
        } while (c != 0);

        // deal with partial last word
        if (shiftAmount > 0) {
            addImmediateOperand(word);
        }
    }